

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void tcp_pinger_new(int vectored_writes)

{
  int iVar1;
  uchar *puVar2;
  undefined8 uVar3;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  pinger_t *pinger;
  sockaddr_in server_addr;
  int r;
  int vectored_writes_local;
  
  server_addr.sin_zero._4_4_ = vectored_writes;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&pinger);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xfc,"uv_ip4_addr(\"127.0.0.1\", 9123, &server_addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = (uchar *)malloc(0x168);
  if (puVar2 == (uchar *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0xfe,"pinger","!=","NULL",0,"!=",0);
    abort();
  }
  *(undefined4 *)puVar2 = server_addr.sin_zero._4_4_;
  puVar2[8] = '\0';
  puVar2[9] = '\0';
  puVar2[10] = '\0';
  puVar2[0xb] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  *(char **)(puVar2 + 0x160) = PING;
  uVar3 = uv_default_loop();
  server_addr.sin_zero._0_4_ = uv_tcp_init(uVar3,puVar2 + 0x10);
  *(uchar **)(puVar2 + 0x10) = puVar2;
  if ((long)(int)server_addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x107,"r","==","0",(long)(int)server_addr.sin_zero._0_4_,"==",0);
    abort();
  }
  server_addr.sin_zero._0_4_ = uv_tcp_connect(puVar2 + 0xf8,puVar2 + 0x10,&pinger,pinger_on_connect)
  ;
  if ((long)(int)server_addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x10f,"r","==","0",(long)(int)server_addr.sin_zero._0_4_,"==",0);
    abort();
  }
  if ((long)pinger_on_connect_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x112,"pinger_on_connect_count","==","0",(long)pinger_on_connect_count,"==",0);
    abort();
  }
  return;
}

Assistant:

static void tcp_pinger_new(int vectored_writes) {
  int r;
  struct sockaddr_in server_addr;
  pinger_t* pinger;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));
  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_tcp_init(uv_default_loop(), &pinger->stream.tcp);
  pinger->stream.tcp.data = pinger;
  ASSERT_OK(r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  r = uv_tcp_connect(&pinger->connect_req,
                     &pinger->stream.tcp,
                     (const struct sockaddr*) &server_addr,
                     pinger_on_connect);
  ASSERT_OK(r);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT_OK(pinger_on_connect_count);
}